

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

void deqp::sl::genCompareOp
               (ostringstream *output,char *dstVec4Var,ValueBlock *valueBlock,
               char *nonFloatNamePrefix,char *checkVarName)

{
  bool bVar1;
  deBool dVar2;
  DataType DVar3;
  size_type sVar4;
  const_reference pvVar5;
  char *a;
  ostream *poVar6;
  char *valueName;
  Value *val;
  int ndx;
  bool isFirstOutput;
  char *checkVarName_local;
  char *nonFloatNamePrefix_local;
  ValueBlock *valueBlock_local;
  char *dstVec4Var_local;
  ostringstream *output_local;
  
  bVar1 = true;
  for (val._0_4_ = 0;
      sVar4 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
              ::size(&valueBlock->values), (int)val < (int)sVar4; val._0_4_ = (int)val + 1) {
    pvVar5 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ::operator[](&valueBlock->values,(long)(int)val);
    a = (char *)std::__cxx11::string::c_str();
    if ((pvVar5->storageType == STORAGE_OUTPUT) &&
       ((checkVarName == (char *)0x0 || (dVar2 = deStringEqual(a,checkVarName), dVar2 != 0)))) {
      if (bVar1) {
        std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,"bool RES = ");
        bVar1 = false;
      }
      else {
        std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,"RES = RES && ")
        ;
      }
      DVar3 = glu::getDataTypeScalarType(pvVar5->dataType);
      if (DVar3 == TYPE_FLOAT) {
        poVar6 = std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,"isOk("
                                );
        poVar6 = std::operator<<(poVar6,a);
        poVar6 = std::operator<<(poVar6,", ref_");
        poVar6 = std::operator<<(poVar6,a);
        std::operator<<(poVar6,", 0.05);\n");
      }
      else {
        poVar6 = std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,"isOk("
                                );
        poVar6 = std::operator<<(poVar6,nonFloatNamePrefix);
        poVar6 = std::operator<<(poVar6,a);
        poVar6 = std::operator<<(poVar6,", ref_");
        poVar6 = std::operator<<(poVar6,a);
        std::operator<<(poVar6,");\n");
      }
    }
  }
  if (bVar1) {
    poVar6 = std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,dstVec4Var)
    ;
    std::operator<<(poVar6," = vec4(1.0);\n");
  }
  else {
    poVar6 = std::operator<<(&output->super_basic_ostream<char,_std::char_traits<char>_>,dstVec4Var)
    ;
    std::operator<<(poVar6," = vec4(RES, RES, RES, 1.0);\n");
  }
  return;
}

Assistant:

static void genCompareOp(ostringstream& output, const char* dstVec4Var, const ShaderCase::ValueBlock& valueBlock,
						 const char* nonFloatNamePrefix, const char* checkVarName)
{
	bool isFirstOutput = true;

	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val	   = valueBlock.values[ndx];
		const char*				 valueName = val.valueName.c_str();

		if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			// Check if we're only interested in one variable (then skip if not the right one).
			if (checkVarName && !deStringEqual(valueName, checkVarName))
				continue;

			// Prefix.
			if (isFirstOutput)
			{
				output << "bool RES = ";
				isFirstOutput = false;
			}
			else
				output << "RES = RES && ";

			// Generate actual comparison.
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				output << "isOk(" << valueName << ", ref_" << valueName << ", 0.05);\n";
			else
				output << "isOk(" << nonFloatNamePrefix << valueName << ", ref_" << valueName << ");\n";
		}
		// \note Uniforms are already declared in shader.
	}

	if (isFirstOutput)
		output << dstVec4Var << " = vec4(1.0);\n"; // \todo [petri] Should we give warning if not expect-failure case?
	else
		output << dstVec4Var << " = vec4(RES, RES, RES, 1.0);\n";
}